

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

bool __thiscall
wallet::CWallet::DelAddressBookWithDB(CWallet *this,WalletBatch *batch,CTxDestination *address)

{
  undefined1 uVar1;
  bool bVar2;
  isminetype iVar3;
  AnnotatedMixin<std::recursive_mutex> *params;
  signal<void_(const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool,_wallet::AddressPurpose,_ChangeType),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool,_wallet::AddressPurpose,_ChangeType)>,_boost::function<void_(const_boost::signals2::connection_&,_const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool,_wallet::AddressPurpose,_ChangeType)>,_boost::signals2::mutex>
  *in_RDX;
  CWallet *in_RDI;
  long in_FS_OFFSET;
  string *dest;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock52;
  undefined4 in_stack_fffffffffffffef8;
  ChangeType in_stack_fffffffffffffefc;
  AddressPurpose in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  undefined7 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0f;
  signal<void_(const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool,_wallet::AddressPurpose,_ChangeType),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool,_wallet::AddressPurpose,_ChangeType)>,_boost::function<void_(const_boost::signals2::connection_&,_const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool,_wallet::AddressPurpose,_ChangeType)>,_boost::signals2::mutex>
  *args;
  undefined8 in_stack_ffffffffffffff18;
  string *in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff29;
  undefined1 in_stack_ffffffffffffff2a;
  undefined1 in_stack_ffffffffffffff2b;
  undefined4 in_stack_ffffffffffffff2c;
  CTxDestination *dest_00;
  char *in_stack_ffffffffffffff48;
  ConstevalFormatString<0U> in_stack_ffffffffffffff68;
  ConstevalFormatString<2U> in_stack_ffffffffffffff78;
  byte local_5a;
  allocator<char> local_59 [49];
  undefined8 local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  dest_00 = (CTxDestination *)&stack0xffffffffffffffd8;
  EncodeDestination_abi_cxx11_
            ((CTxDestination *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
  params = MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
                     ((AnnotatedMixin<std::recursive_mutex> *)
                      CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_RDI,
             (AnnotatedMixin<std::recursive_mutex> *)dest_00,
             (char *)CONCAT44(in_stack_ffffffffffffff2c,
                              CONCAT13(in_stack_ffffffffffffff2b,
                                       CONCAT12(in_stack_ffffffffffffff2a,
                                                CONCAT11(in_stack_ffffffffffffff29,
                                                         in_stack_ffffffffffffff28)))),
             (char *)in_stack_ffffffffffffff20,(int)((ulong)in_stack_ffffffffffffff18 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffff18 >> 0x18,0));
  iVar3 = IsMine((CWallet *)
                 CONCAT44(in_stack_ffffffffffffff2c,
                          CONCAT13(in_stack_ffffffffffffff2b,
                                   CONCAT12(in_stack_ffffffffffffff2a,
                                            CONCAT11(in_stack_ffffffffffffff29,
                                                     in_stack_ffffffffffffff28)))),
                 (CTxDestination *)in_stack_ffffffffffffff20);
  if (iVar3 == ISMINE_NO) {
    uVar1 = WalletBatch::EraseAddressData((WalletBatch *)in_RDI,dest_00);
    if ((bool)uVar1) {
      bVar2 = WalletBatch::ErasePurpose
                        ((WalletBatch *)
                         CONCAT44(iVar3,CONCAT13(uVar1,CONCAT12(in_stack_ffffffffffffff2a,
                                                                CONCAT11(in_stack_ffffffffffffff29,
                                                                         in_stack_ffffffffffffff28))
                                                )),in_stack_ffffffffffffff20);
      if (bVar2) {
        bVar2 = WalletBatch::EraseName
                          ((WalletBatch *)
                           CONCAT44(iVar3,CONCAT13(uVar1,CONCAT12(bVar2,CONCAT11(
                                                  in_stack_ffffffffffffff29,
                                                  in_stack_ffffffffffffff28)))),
                           in_stack_ffffffffffffff20);
        if (bVar2) {
          std::
          map<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_wallet::CAddressBookData,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_wallet::CAddressBookData>_>_>
          ::erase((map<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_wallet::CAddressBookData,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_wallet::CAddressBookData>_>_>
                   *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                  (key_type *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
          uVar1 = (undefined1)((uint)in_stack_ffffffffffffff04 >> 0x18);
          bVar2 = false;
        }
        else {
          in_stack_ffffffffffffff48 = "Error: cannot erase address book entry name\n";
          WalletLogPrintf<>(in_RDI,in_stack_ffffffffffffff68);
          uVar1 = (undefined1)((uint)in_stack_ffffffffffffff04 >> 0x18);
          local_5a = 0;
          bVar2 = true;
        }
      }
      else {
        WalletLogPrintf<>(in_RDI,in_stack_ffffffffffffff68);
        uVar1 = (undefined1)((uint)in_stack_ffffffffffffff04 >> 0x18);
        local_5a = 0;
        bVar2 = true;
      }
    }
    else {
      WalletLogPrintf<>(in_RDI,in_stack_ffffffffffffff68);
      uVar1 = (undefined1)((uint)in_stack_ffffffffffffff04 >> 0x18);
      local_5a = 0;
      bVar2 = true;
    }
  }
  else {
    WalletLogPrintf<char[21],char[42]>
              ((CWallet *)in_stack_ffffffffffffff48,in_stack_ffffffffffffff78,(char (*) [21])params,
               (char (*) [42])in_RDI);
    uVar1 = (undefined1)((uint)in_stack_ffffffffffffff04 >> 0x18);
    local_5a = 0;
    bVar2 = true;
  }
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  if (!bVar2) {
    args = &in_RDI->NotifyAddressBookChanged;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffff48,(char *)params,(allocator<char> *)in_RDI);
    boost::signals2::
    signal<void_(const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool,_wallet::AddressPurpose,_ChangeType),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool,_wallet::AddressPurpose,_ChangeType)>,_boost::function<void_(const_boost::signals2::connection_&,_const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool,_wallet::AddressPurpose,_ChangeType)>,_boost::signals2::mutex>
    ::operator()(in_RDX,(variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                         *)args,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),(bool)uVar1,
                 in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    std::allocator<char>::~allocator(local_59);
    local_5a = 1;
  }
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)(local_5a & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool CWallet::DelAddressBookWithDB(WalletBatch& batch, const CTxDestination& address)
{
    const std::string& dest = EncodeDestination(address);
    {
        LOCK(cs_wallet);
        // If we want to delete receiving addresses, we should avoid calling EraseAddressData because it will delete the previously_spent value. Could instead just erase the label so it becomes a change address, and keep the data.
        // NOTE: This isn't a problem for sending addresses because they don't have any data that needs to be kept.
        // When adding new address data, it should be considered here whether to retain or delete it.
        if (IsMine(address)) {
            WalletLogPrintf("%s called with IsMine address, NOT SUPPORTED. Please report this bug! %s\n", __func__, PACKAGE_BUGREPORT);
            return false;
        }
        // Delete data rows associated with this address
        if (!batch.EraseAddressData(address)) {
            WalletLogPrintf("Error: cannot erase address book entry data\n");
            return false;
        }

        // Delete purpose entry
        if (!batch.ErasePurpose(dest)) {
            WalletLogPrintf("Error: cannot erase address book entry purpose\n");
            return false;
        }

        // Delete name entry
        if (!batch.EraseName(dest)) {
            WalletLogPrintf("Error: cannot erase address book entry name\n");
            return false;
        }

        // finally, remove it from the map
        m_address_book.erase(address);
    }

    // All good, signal changes
    NotifyAddressBookChanged(address, "", /*is_mine=*/false, AddressPurpose::SEND, CT_DELETED);
    return true;
}